

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# muxinternal.c
# Opt level: O1

uint8_t * MuxEmitRiffHeader(uint8_t *data,size_t size)

{
  int iVar1;
  
  data[0] = 'R';
  data[1] = 'I';
  data[2] = 'F';
  data[3] = 'F';
  iVar1 = (int)size + -8;
  data[4] = (uint8_t)iVar1;
  data[5] = (uint8_t)((uint)iVar1 >> 8);
  data[6] = (uint8_t)((uint)iVar1 >> 0x10);
  data[7] = (uint8_t)((uint)iVar1 >> 0x18);
  data[8] = 'W';
  data[9] = 'E';
  data[10] = 'B';
  data[0xb] = 'P';
  return data + 0xc;
}

Assistant:

uint8_t* MuxEmitRiffHeader(uint8_t* const data, size_t size) {
  PutLE32(data + 0, MKFOURCC('R', 'I', 'F', 'F'));
  PutLE32(data + TAG_SIZE, (uint32_t)size - CHUNK_HEADER_SIZE);
  assert(size == (uint32_t)size);
  PutLE32(data + TAG_SIZE + CHUNK_SIZE_BYTES, MKFOURCC('W', 'E', 'B', 'P'));
  return data + RIFF_HEADER_SIZE;
}